

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O3

void __thiscall
glcts::ArraysOfArrays::sized_declarations_invalid_sizes1<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (sized_declarations_invalid_sizes1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  ulong *puVar1;
  TestError *this_00;
  long lVar2;
  long *plVar3;
  string shader_source;
  string invalid_declarations [15];
  undefined1 *local_228;
  undefined8 local_220;
  undefined1 local_218;
  undefined7 uStack_217;
  undefined1 *local_208 [2];
  undefined1 local_1f8 [16];
  undefined1 *local_1e8 [2];
  undefined1 local_1d8 [16];
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  undefined1 *local_1a8 [2];
  undefined1 local_198 [16];
  undefined1 *local_188 [2];
  undefined1 local_178 [16];
  undefined1 *local_168 [2];
  undefined1 local_158 [16];
  undefined1 *local_148 [2];
  undefined1 local_138 [16];
  undefined1 *local_128 [2];
  undefined1 local_118 [16];
  undefined1 *local_108 [2];
  undefined1 local_f8 [16];
  undefined1 *local_e8 [2];
  undefined1 local_d8 [16];
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  long *local_48 [2];
  long local_38 [2];
  
  local_208[0] = local_1f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"float x[2][2][2][0];\n","");
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1e8,"float x[2][2][0][2];\n","");
  local_1c8[0] = local_1b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"float x[2][0][2][2];\n","");
  local_1a8[0] = local_198;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"float x[0][2][2][2];\n","");
  local_188[0] = local_178;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_188,"float x[2][2][0][0];\n","");
  local_168[0] = local_158;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"float x[2][0][2][0];\n","");
  local_148[0] = local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"float x[0][2][2][0];\n","");
  local_128[0] = local_118;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"float x[2][0][0][2];\n","");
  local_108[0] = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_108,"float x[0][2][0][2];\n","");
  local_e8[0] = local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"float x[0][0][2][2];\n","");
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"float x[2][0][0][0];\n","");
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"float x[0][2][0][0];\n","");
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"float x[0][0][2][0];\n","");
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"float x[0][0][0][2];\n","");
  plVar3 = local_38;
  local_48[0] = plVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"float x[0][0][0][0];\n","");
  local_220 = 0;
  local_218 = 0;
  local_228 = &local_218;
  std::__cxx11::string::_M_assign((string *)&local_228);
  std::__cxx11::string::_M_append((char *)&local_228,(ulong)local_208[0]);
  switch((ulong)tested_shader_type) {
  case 0:
  case 2:
  case 5:
    goto switchD_00b20396_caseD_0;
  case 1:
    std::__cxx11::string::append((char *)&local_228);
    goto switchD_00b20396_caseD_0;
  case 3:
    puVar1 = &emit_quad_abi_cxx11_;
    break;
  case 4:
    puVar1 = &set_tesseation_abi_cxx11_;
    break;
  default:
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x707);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::_M_append((char *)&local_228,*puVar1);
switchD_00b20396_caseD_0:
  std::__cxx11::string::_M_append((char *)&local_228,shader_end_abi_cxx11_);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[8])(this,(ulong)tested_shader_type,&local_228);
  if (local_228 != &local_218) {
    operator_delete(local_228,CONCAT71(uStack_217,local_218) + 1);
  }
  lVar2 = -0x1e0;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0);
  return;
}

Assistant:

void sized_declarations_invalid_sizes1<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string invalid_declarations[] = {
		"float x[2][2][2][0];\n", "float x[2][2][0][2];\n", "float x[2][0][2][2];\n", "float x[0][2][2][2];\n",
		"float x[2][2][0][0];\n", "float x[2][0][2][0];\n", "float x[0][2][2][0];\n", "float x[2][0][0][2];\n",
		"float x[0][2][0][2];\n", "float x[0][0][2][2];\n", "float x[2][0][0][0];\n", "float x[0][2][0][0];\n",
		"float x[0][0][2][0];\n", "float x[0][0][0][2];\n", "float x[0][0][0][0];\n"
	};

	for (size_t invalid_declarations_index = 0;
		 invalid_declarations_index < sizeof(invalid_declarations) / sizeof(invalid_declarations);
		 invalid_declarations_index++)
	{
		std::string shader_source;

		shader_source = shader_start;
		shader_source += invalid_declarations[invalid_declarations_index];

		/* End main */
		DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

		/* Execute test */
		this->execute_negative_test(tested_shader_type, shader_source);
	} /* for (int invalid_declarations_index = 0; ...) */
}